

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

bool sym_IsConstant(Symbol *sym)

{
  Section *pSVar1;
  bool local_22;
  bool local_21;
  Section *sect;
  Symbol *sym_local;
  
  if (sym->type == SYM_LABEL) {
    pSVar1 = sym_GetSection(sym);
    local_21 = false;
    if (pSVar1 != (Section *)0x0) {
      local_21 = pSVar1->org != 0xffffffff;
    }
    sym_local._7_1_ = local_21;
  }
  else {
    local_22 = true;
    if (sym->type != SYM_EQU) {
      local_22 = sym->type == SYM_VAR;
    }
    sym_local._7_1_ = local_22;
  }
  return sym_local._7_1_;
}

Assistant:

static inline bool sym_IsConstant(struct Symbol const *sym)
{
	if (sym->type == SYM_LABEL) {
		struct Section const *sect = sym_GetSection(sym);

		return sect && sect->org != (uint32_t)-1;
	}
	return sym->type == SYM_EQU || sym->type == SYM_VAR;
}